

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.h
# Opt level: O0

void __thiscall
QXmlStreamEntityDeclaration::~QXmlStreamEntityDeclaration(QXmlStreamEntityDeclaration *this)

{
  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x1336f0);
  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x1336fe);
  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x13370c);
  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x13371a);
  QtPrivate::QXmlString::~QXmlString((QXmlString *)0x133724);
  return;
}

Assistant:

class Q_CORE_EXPORT QXmlStreamEntityDeclaration {
    QtPrivate::QXmlString m_name, m_notationName, m_systemId, m_publicId, m_value;

    friend class QXmlStreamReaderPrivate;
public:
    QXmlStreamEntityDeclaration();

    inline QStringView name() const { return m_name; }
    inline QStringView notationName() const { return m_notationName; }
    inline QStringView systemId() const { return m_systemId; }
    inline QStringView publicId() const { return m_publicId; }
    inline QStringView value() const { return m_value; }
#if QT_CORE_REMOVED_SINCE(6, 8)
    inline bool operator==(const QXmlStreamEntityDeclaration &other) const
    { return comparesEqual(*this, other); }
    inline bool operator!=(const QXmlStreamEntityDeclaration &other) const
    { return !operator==(other); }
#endif

private:
    friend bool comparesEqual(const QXmlStreamEntityDeclaration &lhs,
                              const QXmlStreamEntityDeclaration &rhs) noexcept
    {
        return lhs.m_name == rhs.m_name
            && lhs.m_notationName == rhs.m_notationName
            && lhs.m_systemId == rhs.m_systemId
            && lhs.m_publicId == rhs.m_publicId
            && lhs.m_value == rhs.m_value;
    }